

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  StringRef enums;
  bool bVar1;
  EnumInfo *this;
  pointer pEVar2;
  size_type sVar3;
  size_type sVar4;
  reference piVar5;
  const_reference __args_1;
  __uniq_ptr_data<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>,_true,_true>
  this_00;
  vector<int,_std::allocator<int>_> *in_R9;
  int local_9c;
  const_iterator cStack_98;
  int value;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t i;
  undefined1 local_68 [8];
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  vector<int,_std::allocator<int>_> *values_local;
  StringRef allValueNames_local;
  StringRef enumName_local;
  unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> *enumInfo;
  
  this_00.
  super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>._M_t
  .super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>.
  super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl =
       (__uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>)
       enumName.m_start;
  this = (EnumInfo *)operator_new(0x28);
  EnumInfo::EnumInfo(this);
  std::unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>>::
  unique_ptr<std::default_delete<Catch::Detail::EnumInfo>,void>
            ((unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>> *)
             this_00.
             super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
             .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl,this);
  pEVar2 = clara::std::
           unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
           operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                       *)this_00.
                         super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
                         .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl);
  (pEVar2->m_name).m_start = (char *)enumName.m_size;
  (pEVar2->m_name).m_size = (size_type)allValueNames.m_start;
  pEVar2 = clara::std::
           unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
           operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                       *)this_00.
                         super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
                         .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl);
  sVar3 = clara::std::vector<int,_std::allocator<int>_>::size(in_R9);
  clara::std::
  vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>::
  reserve(&pEVar2->m_values,sVar3);
  enums.m_size = (size_type)values;
  enums.m_start = (char *)allValueNames.m_size;
  parseEnums((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_68,enums);
  sVar3 = clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::size
                    ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_68);
  sVar4 = clara::std::vector<int,_std::allocator<int>_>::size(in_R9);
  if (sVar3 != sVar4) {
    __assert_fail("valueNames.size() == values.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch.hpp"
                  ,0x297b,
                  "std::unique_ptr<EnumInfo> Catch::Detail::makeEnumInfo(StringRef, StringRef, const std::vector<int> &)"
                 );
  }
  __range2 = (vector<int,_std::allocator<int>_> *)0x0;
  __end2 = clara::std::vector<int,_std::allocator<int>_>::begin(in_R9);
  cStack_98 = clara::std::vector<int,_std::allocator<int>_>::end(in_R9);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff68), bVar1) {
    piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end2);
    local_9c = *piVar5;
    pEVar2 = clara::std::
             unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
             operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                         *)this_00.
                           super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
                           .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl);
    __args_1 = clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::operator[]
                         ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_68,
                          (size_type)__range2);
    std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>::
    emplace_back<int&,Catch::StringRef_const&>
              ((vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>
                *)&pEVar2->m_values,&local_9c,__args_1);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
    __range2 = __range2 + 1;
  }
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~vector
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)local_68);
  return (__uniq_ptr_data<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>,_true,_true>
          )(tuple<Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>)
           this_00.
           super___uniq_ptr_impl<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
           .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            std::unique_ptr<EnumInfo> enumInfo( new EnumInfo );
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }